

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.cc
# Opt level: O1

Status * __thiscall
draco::Encoder::SetAttributePredictionScheme
          (Status *__return_storage_ptr__,Encoder *this,Type type,int prediction_scheme_method)

{
  Options *this_00;
  Type local_44;
  string local_40;
  
  local_44 = type;
  EncoderBase<draco::EncoderOptionsBase<draco::GeometryAttribute::Type>_>::CheckPredictionScheme
            (__return_storage_ptr__,
             &this->super_EncoderBase<draco::EncoderOptionsBase<draco::GeometryAttribute::Type>_>,
             type,prediction_scheme_method);
  if (__return_storage_ptr__->code_ == OK) {
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"prediction_scheme","");
    this_00 = DracoOptions<draco::GeometryAttribute::Type>::GetAttributeOptions
                        (&(this->
                          super_EncoderBase<draco::EncoderOptionsBase<draco::GeometryAttribute::Type>_>
                          ).options_.super_DracoOptions<draco::GeometryAttribute::Type>,&local_44);
    Options::SetInt(this_00,&local_40,prediction_scheme_method);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Status Encoder::SetAttributePredictionScheme(GeometryAttribute::Type type,
                                             int prediction_scheme_method) {
  Status status = CheckPredictionScheme(type, prediction_scheme_method);
  if (!status.ok()) {
    return status;
  }
  options().SetAttributeInt(type, "prediction_scheme",
                            prediction_scheme_method);
  return status;
}